

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_key_helpers.hpp
# Opt level: O2

void duckdb::AggregateSortKeyHelpers::
     UnaryUpdate<duckdb::MinMaxStringState,duckdb::MaxOperationVector,(duckdb::OrderType)3,false>
               (Vector *inputs,AggregateInputData *input_data,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  ulong uVar1;
  ulong uVar2;
  idx_t i;
  ulong uVar3;
  string_t input;
  LogicalType local_180;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat kdata;
  Vector sort_key;
  UnifiedVectorFormat idata;
  
  LogicalType::LogicalType(&local_180,BLOB);
  Vector::Vector(&sort_key,&local_180,0x800);
  LogicalType::~LogicalType(&local_180);
  CreateSortKeyHelpers::CreateSortKey(inputs,count,(OrderModifiers)0x303,&sort_key);
  UnifiedVectorFormat::UnifiedVectorFormat(&idata);
  UnifiedVectorFormat::UnifiedVectorFormat(&kdata);
  Vector::ToUnifiedFormat(&sort_key,count,&kdata);
  UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
  Vector::ToUnifiedFormat(state_vector,count,&sdata);
  for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = uVar3;
    if ((sdata.sel)->sel_vector != (sel_t *)0x0) {
      uVar1 = (ulong)(sdata.sel)->sel_vector[uVar3];
    }
    uVar2 = uVar3;
    if ((kdata.sel)->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)(kdata.sel)->sel_vector[uVar3];
    }
    input.value.pointer.ptr = (char *)*(undefined8 *)(kdata.data + uVar2 * 0x10 + 8);
    input.value._0_8_ = *(undefined8 *)(kdata.data + uVar2 * 0x10);
    VectorMinMaxBase<(duckdb::OrderType)3>::
    Execute<duckdb::string_t,duckdb::MinMaxStringState,duckdb::MaxOperationVector>
              (*(MinMaxStringState **)(sdata.data + uVar1 * 8),input,input_data);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&kdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&idata);
  Vector::~Vector(&sort_key);
  return;
}

Assistant:

static void UnaryUpdate(Vector inputs[], AggregateInputData &input_data, idx_t input_count, Vector &state_vector,
	                        idx_t count) {
		D_ASSERT(input_count == 1);
		auto &input = inputs[0];

		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, sort_key);

		UnifiedVectorFormat idata;
		if (IGNORE_NULLS) {
			input.ToUnifiedFormat(count, idata);
		}

		UnifiedVectorFormat kdata;
		sort_key.ToUnifiedFormat(count, kdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		auto key_data = UnifiedVectorFormat::GetData<string_t>(kdata);
		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto sidx = sdata.sel->get_index(i);
			if (IGNORE_NULLS) {
				auto idx = idata.sel->get_index(i);
				if (!idata.validity.RowIsValid(idx)) {
					continue;
				}
			}
			const auto key_idx = kdata.sel->get_index(i);
			auto &state = *states[sidx];
			OP::template Execute<string_t, STATE, OP>(state, key_data[key_idx], input_data);
		}
	}